

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_address.cpp
# Opt level: O0

DescriptorScriptData * __thiscall
cfd::AddressFactory::ParseOutputDescriptor
          (AddressFactory *this,string *descriptor,string *bip32_derivation_path,
          vector<cfd::DescriptorScriptData,_std::allocator<cfd::DescriptorScriptData>_> *script_list
          ,vector<cfd::DescriptorKeyData,_std::allocator<cfd::DescriptorKeyData>_>
           *multisig_key_list,
          vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> *key_list)

{
  bool bVar1;
  byte bVar2;
  uint uVar3;
  DescriptorScriptType DVar4;
  AddressType AVar5;
  uint uVar6;
  uint32_t uVar7;
  int iVar8;
  DescriptorKeyType DVar9;
  undefined4 uVar10;
  reference pvVar11;
  reference pvVar12;
  vector *in_RDX;
  DescriptorScriptData *in_RDI;
  long in_R8;
  long in_R9;
  long in_stack_00000008;
  DescriptorKeyData key_data;
  DescriptorKeyReference *ref_1;
  iterator __end2_2;
  iterator __begin2_2;
  vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
  *__range2_2;
  DescriptorScriptData data;
  DescriptorScriptReference child;
  uint32_t depth;
  bool is_loop;
  DescriptorScriptReference script_ref;
  DescriptorScriptData ref_data;
  DescriptorScriptReference *ref;
  iterator __end2_1;
  iterator __begin2_1;
  vector<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
  *__range2_1;
  DescriptorKeyReference key_ref;
  bool use_script_list;
  uint32_t multisig_req_num;
  vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
  multisig_keys;
  DescriptorNode node;
  vector<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
  script_refs;
  KeyData *key;
  iterator __end2;
  iterator __begin2;
  vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> *__range2;
  vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> temp_list;
  uint32_t index;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  args;
  Descriptor desc;
  DescriptorScriptData *result;
  vector<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
  *in_stack_ffffffffffffdb08;
  DescriptorScriptData *in_stack_ffffffffffffdb10;
  undefined4 in_stack_ffffffffffffdb18;
  undefined4 in_stack_ffffffffffffdb1c;
  string *in_stack_ffffffffffffdb20;
  int in_stack_ffffffffffffdb40;
  int in_stack_ffffffffffffdb44;
  reference local_2408;
  DescriptorKeyReference *local_2400;
  __normal_iterator<cfd::core::DescriptorKeyReference_*,_std::vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>_>
  local_23f8;
  undefined1 *local_23f0;
  DescriptorScriptReference local_23e8 [40];
  DescriptorKeyReference *in_stack_ffffffffffffdc40;
  anon_class_1_0_00000001 *in_stack_ffffffffffffdc48;
  string local_2098 [32];
  string local_2078 [32];
  vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
  local_2058;
  Script local_2040;
  Address local_2008 [376];
  Script local_1e90;
  Script local_1e58;
  DescriptorScriptReference local_1e08 [848];
  Script local_1ab8;
  undefined4 local_1a80;
  Script local_1a78;
  int local_1a40;
  Address local_1a38 [376];
  undefined4 local_18c0;
  Script local_18b8;
  undefined4 local_1880;
  string local_1878 [32];
  uint32_t local_1858;
  DescriptorScriptReference local_1748 [848];
  Script local_13f8;
  int local_13c0;
  byte local_13b9;
  DescriptorScriptReference local_13b8 [872];
  string local_1050 [144];
  string local_fc0 [152];
  string local_f28 [32];
  TaprootScriptTree local_f08 [144];
  TapBranch local_e78 [120];
  vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
  local_e00 [2];
  string local_dd0 [32];
  vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
  local_db0;
  string local_d98 [32];
  vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
  local_d78;
  Script local_d60;
  Address local_d28 [376];
  Script local_bb0;
  undefined4 local_b78;
  Script local_b70;
  undefined4 local_b38;
  Address local_b30 [376];
  undefined4 local_9b8;
  Script local_9b0;
  DescriptorKeyType local_978;
  string local_970 [304];
  reference local_840;
  DescriptorScriptReference *local_838;
  __normal_iterator<cfd::core::DescriptorScriptReference_*,_std::vector<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>_>
  local_830;
  vector *local_828;
  DescriptorKeyReference local_820 [659];
  byte local_58d;
  uint32_t local_58c;
  undefined1 local_588 [24];
  Script local_570;
  Address local_538 [376];
  Script local_3c0;
  DescriptorNode local_388 [360];
  vector local_220 [24];
  reference local_208;
  KeyData *local_200;
  __normal_iterator<cfd::core::KeyData_*,_std::vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>_>
  local_1f8;
  vector *local_1f0;
  vector local_1e8 [28];
  uint local_1cc;
  string local_1a0 [367];
  byte local_31;
  long local_30;
  long local_28;
  vector *local_18;
  
  local_30 = in_R9;
  local_28 = in_R8;
  local_18 = in_RDX;
  if (in_R8 != 0) {
    std::vector<cfd::DescriptorScriptData,_std::allocator<cfd::DescriptorScriptData>_>::clear
              ((vector<cfd::DescriptorScriptData,_std::allocator<cfd::DescriptorScriptData>_> *)
               0x3d13da);
  }
  if (local_30 != 0) {
    std::vector<cfd::DescriptorKeyData,_std::allocator<cfd::DescriptorKeyData>_>::clear
              ((vector<cfd::DescriptorKeyData,_std::allocator<cfd::DescriptorKeyData>_> *)0x3d13f2);
  }
  local_31 = 0;
  DescriptorScriptData::DescriptorScriptData
            ((DescriptorScriptData *)CONCAT44(in_stack_ffffffffffffdb44,in_stack_ffffffffffffdb40));
  in_RDI->key_type = kDescriptorKeyNull;
  in_RDI->address_type = kP2shAddress;
  in_RDI->multisig_req_sig_num = 0;
  cfd::core::Descriptor::Parse(local_1a0,local_18);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x3d145d);
  for (local_1cc = 0; uVar6 = local_1cc, uVar3 = cfd::core::Descriptor::GetNeedArgumentNum(),
      uVar6 < uVar3; local_1cc = local_1cc + 1) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)in_stack_ffffffffffffdb20,
                (value_type *)CONCAT44(in_stack_ffffffffffffdb1c,in_stack_ffffffffffffdb18));
  }
  if (in_stack_00000008 != 0) {
    cfd::core::Descriptor::GetKeyDataAll(local_1e8);
    local_1f0 = local_1e8;
    local_1f8._M_current =
         (KeyData *)
         std::vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>::begin
                   ((vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> *)
                    in_stack_ffffffffffffdb08);
    local_200 = (KeyData *)
                std::vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>::end
                          ((vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> *)
                           in_stack_ffffffffffffdb08);
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<cfd::core::KeyData_*,_std::vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>_>
                               *)in_stack_ffffffffffffdb10,
                              (__normal_iterator<cfd::core::KeyData_*,_std::vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>_>
                               *)in_stack_ffffffffffffdb08), bVar1) {
      local_208 = __gnu_cxx::
                  __normal_iterator<cfd::core::KeyData_*,_std::vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>_>
                  ::operator*(&local_1f8);
      std::vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>::push_back
                ((vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> *)
                 in_stack_ffffffffffffdb20,
                 (value_type *)CONCAT44(in_stack_ffffffffffffdb1c,in_stack_ffffffffffffdb18));
      __gnu_cxx::
      __normal_iterator<cfd::core::KeyData_*,_std::vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>_>
      ::operator++(&local_1f8);
    }
    std::vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>::~vector
              ((vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> *)
               in_stack_ffffffffffffdb20);
  }
  cfd::core::Descriptor::GetReferenceAll(local_220);
  cfd::core::Descriptor::GetNode();
  DVar4 = core::DescriptorNode::GetScriptType(local_388);
  in_RDI->type = DVar4;
  in_RDI->key_type = kDescriptorKeyNull;
  in_RDI->depth = 0;
  std::
  vector<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
  ::operator[]((vector<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
                *)local_220,0);
  cfd::core::DescriptorScriptReference::GetLockingScript();
  cfd::core::Script::operator=(&in_RDI->locking_script,&local_3c0);
  core::Script::~Script((Script *)in_stack_ffffffffffffdb10);
  std::
  vector<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
  ::operator[]((vector<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
                *)local_220,0);
  bVar2 = cfd::core::DescriptorScriptReference::HasAddress();
  if ((bVar2 & 1) != 0) {
    std::
    vector<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
    ::operator[]((vector<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
                  *)local_220,0);
    cfd::core::DescriptorScriptReference::GenerateAddress((NetType)local_538);
    cfd::core::Address::operator=(&in_RDI->address,local_538);
    core::Address::~Address((Address *)in_stack_ffffffffffffdb10);
    std::
    vector<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
    ::operator[]((vector<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
                  *)local_220,0);
    AVar5 = cfd::core::DescriptorScriptReference::GetAddressType();
    in_RDI->address_type = AVar5;
  }
  std::
  vector<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
  ::operator[]((vector<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
                *)local_220,0);
  bVar2 = cfd::core::DescriptorScriptReference::HasRedeemScript();
  if ((bVar2 & 1) != 0) {
    std::
    vector<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
    ::operator[]((vector<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
                  *)local_220,0);
    cfd::core::DescriptorScriptReference::GetRedeemScript();
    cfd::core::Script::operator=(&in_RDI->redeem_script,&local_570);
    core::Script::~Script((Script *)in_stack_ffffffffffffdb10);
  }
  std::vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
  ::vector((vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
            *)0x3d1899);
  local_58c = 0;
  local_58d = 0;
  cfd::core::DescriptorKeyReference::DescriptorKeyReference(local_820);
  uVar6 = in_RDI->type - kDescriptorScriptSh;
  if (10 < uVar6 && in_RDI->type != kDescriptorScriptTaproot) goto switchD_003d18f0_caseD_3d2208;
  switch((long)&switchD_003d18f0::switchdataD_004fc9c0 +
         (long)(int)(&switchD_003d18f0::switchdataD_004fc9c0)[uVar6]) {
  case 0x3d190b:
    local_828 = local_220;
    local_830._M_current =
         (DescriptorScriptReference *)
         std::
         vector<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
         ::begin(in_stack_ffffffffffffdb08);
    local_838 = (DescriptorScriptReference *)
                std::
                vector<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
                ::end(in_stack_ffffffffffffdb08);
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<cfd::core::DescriptorScriptReference_*,_std::vector<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>_>
                               *)in_stack_ffffffffffffdb10,
                              (__normal_iterator<cfd::core::DescriptorScriptReference_*,_std::vector<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>_>
                               *)in_stack_ffffffffffffdb08), bVar1) {
      local_840 = __gnu_cxx::
                  __normal_iterator<cfd::core::DescriptorScriptReference_*,_std::vector<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>_>
                  ::operator*(&local_830);
      DescriptorScriptData::DescriptorScriptData
                ((DescriptorScriptData *)
                 CONCAT44(in_stack_ffffffffffffdb44,in_stack_ffffffffffffdb40));
      local_b78 = cfd::core::DescriptorScriptReference::GetScriptType();
      local_b38 = 0;
      cfd::core::DescriptorScriptReference::GetLockingScript();
      cfd::core::Script::operator=(&local_b70,&local_bb0);
      core::Script::~Script((Script *)in_stack_ffffffffffffdb10);
      bVar2 = cfd::core::DescriptorScriptReference::HasAddress();
      if ((bVar2 & 1) == 0) {
        local_9b8 = 1;
      }
      else {
        cfd::core::DescriptorScriptReference::GenerateAddress((NetType)local_d28);
        cfd::core::Address::operator=(local_b30,local_d28);
        core::Address::~Address((Address *)in_stack_ffffffffffffdb10);
        local_9b8 = cfd::core::DescriptorScriptReference::GetAddressType();
      }
      bVar2 = cfd::core::DescriptorScriptReference::HasRedeemScript();
      if ((bVar2 & 1) == 0) {
        cfd::core::DescriptorScriptReference::GetKeyList();
        pvVar12 = std::
                  vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
                  ::operator[](&local_d78,0);
        cfd::core::DescriptorKeyReference::operator=(local_820,pvVar12);
        std::
        vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
        ::~vector((vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
                   *)in_stack_ffffffffffffdb20);
        local_978 = cfd::core::DescriptorKeyReference::GetKeyType();
        const::$_0::operator()::DescriptorKeyReference_const___const
                  (in_stack_ffffffffffffdc48,in_stack_ffffffffffffdc40);
        std::__cxx11::string::operator=(local_970,local_d98);
        std::__cxx11::string::~string(local_d98);
        if (in_RDI->key_type == kDescriptorKeyNull) {
          in_RDI->key_type = local_978;
          std::__cxx11::string::operator=((string *)&in_RDI->key,local_970);
        }
      }
      else {
        cfd::core::DescriptorScriptReference::GetRedeemScript();
        cfd::core::Script::operator=(&local_9b0,&local_d60);
        core::Script::~Script((Script *)in_stack_ffffffffffffdb10);
        local_978 = kDescriptorKeyNull;
      }
      if (local_28 != 0) {
        std::vector<cfd::DescriptorScriptData,_std::allocator<cfd::DescriptorScriptData>_>::
        push_back((vector<cfd::DescriptorScriptData,_std::allocator<cfd::DescriptorScriptData>_> *)
                  in_stack_ffffffffffffdb20,
                  (value_type *)CONCAT44(in_stack_ffffffffffffdb1c,in_stack_ffffffffffffdb18));
      }
      DescriptorScriptData::~DescriptorScriptData(in_stack_ffffffffffffdb10);
      __gnu_cxx::
      __normal_iterator<cfd::core::DescriptorScriptReference_*,_std::vector<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>_>
      ::operator++(&local_830);
    }
    break;
  case 0x3d1d0c:
    local_58d = 1;
    break;
  case 0x3d1d19:
    std::
    vector<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
    ::operator[]((vector<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
                  *)local_220,0);
    cfd::core::DescriptorScriptReference::GetKeyList();
    pvVar12 = std::
              vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
              ::operator[](&local_db0,0);
    cfd::core::DescriptorKeyReference::operator=(local_820,pvVar12);
    std::
    vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>::
    ~vector((vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
             *)in_stack_ffffffffffffdb20);
    DVar9 = cfd::core::DescriptorKeyReference::GetKeyType();
    in_RDI->key_type = DVar9;
    const::$_0::operator()::DescriptorKeyReference_const___const
              (in_stack_ffffffffffffdc48,in_stack_ffffffffffffdc40);
    std::__cxx11::string::operator=((string *)&in_RDI->key,local_dd0);
    std::__cxx11::string::~string(local_dd0);
    break;
  case 0x3d1e03:
    std::
    vector<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
    ::operator[]((vector<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
                  *)local_220,0);
    cfd::core::DescriptorScriptReference::GetKeyList();
    std::
    vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>::
    operator=((vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
               *)in_stack_ffffffffffffdb20,
              (vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
               *)CONCAT44(in_stack_ffffffffffffdb1c,in_stack_ffffffffffffdb18));
    std::
    vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>::
    ~vector((vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
             *)in_stack_ffffffffffffdb20);
    std::
    vector<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
    ::operator[]((vector<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
                  *)local_220,0);
    uVar7 = cfd::core::DescriptorScriptReference::GetReqNum();
    in_RDI->multisig_req_sig_num = uVar7;
    break;
  case 0x3d1e80:
    std::
    vector<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
    ::operator[]((vector<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
                  *)local_220,0);
    cfd::core::DescriptorScriptReference::GetKeyList();
    pvVar12 = std::
              vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
              ::operator[](local_e00,0);
    cfd::core::DescriptorKeyReference::operator=(local_820,pvVar12);
    std::
    vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>::
    ~vector((vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
             *)in_stack_ffffffffffffdb20);
    std::
    vector<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
    ::operator[]((vector<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
                  *)local_220,0);
    cfd::core::DescriptorScriptReference::GetTapBranch();
    cfd::core::TapBranch::operator=(&in_RDI->branch,local_e78);
    core::TapBranch::~TapBranch((TapBranch *)in_stack_ffffffffffffdb10);
    std::
    vector<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
    ::operator[]((vector<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
                  *)local_220,0);
    cfd::core::DescriptorScriptReference::GetScriptTree();
    cfd::core::TaprootScriptTree::operator=(&in_RDI->tree,local_f08);
    core::TaprootScriptTree::~TaprootScriptTree((TaprootScriptTree *)in_stack_ffffffffffffdb10);
    DVar9 = cfd::core::DescriptorKeyReference::GetKeyType();
    in_RDI->key_type = DVar9;
    bVar2 = cfd::core::DescriptorKeyReference::HasExtPrivkey();
    if ((bVar2 & 1) == 0) {
      bVar2 = cfd::core::DescriptorKeyReference::HasExtPubkey();
      if ((bVar2 & 1) == 0) {
        in_RDI->key_type = kDescriptorKeySchnorr;
        cfd::core::DescriptorKeyReference::GetSchnorrPubkey();
        cfd::core::SchnorrPubkey::GetHex_abi_cxx11_();
        std::__cxx11::string::operator=((string *)&in_RDI->key,local_1050);
        std::__cxx11::string::~string(local_1050);
        core::SchnorrPubkey::~SchnorrPubkey((SchnorrPubkey *)0x3d21da);
      }
      else {
        cfd::core::DescriptorKeyReference::GetExtPubkey();
        cfd::core::ExtPubkey::ToString_abi_cxx11_();
        std::__cxx11::string::operator=((string *)&in_RDI->key,local_fc0);
        std::__cxx11::string::~string(local_fc0);
        core::ExtPubkey::~ExtPubkey((ExtPubkey *)in_stack_ffffffffffffdb10);
      }
    }
    else {
      cfd::core::DescriptorKeyReference::GetExtPrivkey();
      cfd::core::ExtPrivkey::ToString_abi_cxx11_();
      std::__cxx11::string::operator=((string *)&in_RDI->key,local_f28);
      std::__cxx11::string::~string(local_f28);
      core::ExtPrivkey::~ExtPrivkey((ExtPrivkey *)in_stack_ffffffffffffdb10);
    }
    break;
  case 0x3d2206:
  case 0x3d2208:
switchD_003d18f0_caseD_3d2208:
  }
  if ((local_58d & 1) != 0) {
    pvVar11 = std::
              vector<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
              ::operator[]((vector<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
                            *)local_220,0);
    cfd::core::DescriptorScriptReference::DescriptorScriptReference(local_13b8,pvVar11);
    local_13b9 = cfd::core::DescriptorScriptReference::HasChild();
    local_13b9 = local_13b9 & 1;
    local_13c0 = 0;
    if (local_13b9 == 0) {
      cfd::core::DescriptorScriptReference::GetRedeemScript();
    }
    else {
      cfd::core::Script::Script(&local_13f8);
    }
    cfd::core::Script::operator=(&in_RDI->redeem_script,&local_13f8);
    core::Script::~Script((Script *)in_stack_ffffffffffffdb10);
    while ((local_13b9 & 1) != 0) {
      cfd::core::DescriptorScriptReference::DescriptorScriptReference(local_1748);
      DescriptorScriptData::DescriptorScriptData
                ((DescriptorScriptData *)
                 CONCAT44(in_stack_ffffffffffffdb44,in_stack_ffffffffffffdb40));
      iVar8 = cfd::core::DescriptorScriptReference::GetScriptType();
      if (iVar8 - 1U < 2) {
        bVar2 = cfd::core::DescriptorScriptReference::HasChild();
        if ((bVar2 & 1) == 0) {
          cfd::core::DescriptorScriptReference::GetRedeemScript();
          cfd::core::Script::operator=(&in_RDI->redeem_script,&local_1ab8);
          core::Script::~Script((Script *)in_stack_ffffffffffffdb10);
        }
        else {
          cfd::core::DescriptorScriptReference::GetChild();
          cfd::core::DescriptorScriptReference::operator=(local_1748,local_1e08);
          core::DescriptorScriptReference::~DescriptorScriptReference
                    ((DescriptorScriptReference *)in_stack_ffffffffffffdb10);
          iVar8 = cfd::core::DescriptorScriptReference::GetScriptType();
          if ((iVar8 == 7) ||
             (iVar8 = cfd::core::DescriptorScriptReference::GetScriptType(), iVar8 == 8)) {
            cfd::core::DescriptorScriptReference::GetKeyList();
            std::
            vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
            ::operator=((vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
                         *)in_stack_ffffffffffffdb20,
                        (vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
                         *)CONCAT44(in_stack_ffffffffffffdb1c,in_stack_ffffffffffffdb18));
            std::
            vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
            ::~vector((vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
                       *)in_stack_ffffffffffffdb20);
            local_58c = cfd::core::DescriptorScriptReference::GetReqNum();
            in_RDI->multisig_req_sig_num = local_58c;
            local_13b9 = 0;
          }
          else {
            in_stack_ffffffffffffdb44 = cfd::core::DescriptorScriptReference::GetScriptType();
            if (in_stack_ffffffffffffdb44 == 0xb) {
              local_13b9 = 0;
            }
          }
          in_stack_ffffffffffffdb40 = cfd::core::DescriptorScriptReference::GetScriptType();
          if (in_stack_ffffffffffffdb40 != 5) {
            cfd::core::DescriptorScriptReference::GetRedeemScript();
            cfd::core::Script::operator=(&in_RDI->redeem_script,&local_1e58);
            core::Script::~Script((Script *)in_stack_ffffffffffffdb10);
          }
        }
      }
      else {
        local_13b9 = 0;
      }
      local_1a80 = cfd::core::DescriptorScriptReference::GetScriptType();
      local_1a40 = local_13c0;
      cfd::core::DescriptorScriptReference::GetLockingScript();
      cfd::core::Script::operator=(&local_1a78,&local_1e90);
      core::Script::~Script((Script *)in_stack_ffffffffffffdb10);
      cfd::core::DescriptorScriptReference::GenerateAddress((NetType)local_2008);
      cfd::core::Address::operator=(local_1a38,local_2008);
      core::Address::~Address((Address *)in_stack_ffffffffffffdb10);
      local_18c0 = cfd::core::DescriptorScriptReference::GetAddressType();
      bVar2 = cfd::core::DescriptorScriptReference::HasRedeemScript();
      if ((bVar2 & 1) != 0) {
        cfd::core::DescriptorScriptReference::GetRedeemScript();
        cfd::core::Script::operator=(&local_18b8,&local_2040);
        core::Script::~Script((Script *)in_stack_ffffffffffffdb10);
      }
      bVar2 = cfd::core::DescriptorScriptReference::HasKey();
      if ((bVar2 & 1) == 0) {
        local_1880 = 0;
      }
      else {
        cfd::core::DescriptorScriptReference::GetKeyList();
        pvVar12 = std::
                  vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
                  ::operator[](&local_2058,0);
        cfd::core::DescriptorKeyReference::operator=(local_820,pvVar12);
        std::
        vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
        ::~vector((vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
                   *)in_stack_ffffffffffffdb20);
        local_1880 = cfd::core::DescriptorKeyReference::GetKeyType();
        const::$_0::operator()::DescriptorKeyReference_const___const
                  (in_stack_ffffffffffffdc48,in_stack_ffffffffffffdc40);
        in_stack_ffffffffffffdb20 = local_2078;
        std::__cxx11::string::operator=(local_1878,in_stack_ffffffffffffdb20);
        std::__cxx11::string::~string(in_stack_ffffffffffffdb20);
        DVar9 = cfd::core::DescriptorKeyReference::GetKeyType();
        in_RDI->key_type = DVar9;
        const::$_0::operator()::DescriptorKeyReference_const___const
                  (in_stack_ffffffffffffdc48,in_stack_ffffffffffffdc40);
        std::__cxx11::string::operator=((string *)&in_RDI->key,local_2098);
        std::__cxx11::string::~string(local_2098);
      }
      local_1858 = local_58c;
      if (local_28 != 0) {
        std::vector<cfd::DescriptorScriptData,_std::allocator<cfd::DescriptorScriptData>_>::
        push_back((vector<cfd::DescriptorScriptData,_std::allocator<cfd::DescriptorScriptData>_> *)
                  in_stack_ffffffffffffdb20,
                  (value_type *)CONCAT44(in_stack_ffffffffffffdb1c,in_stack_ffffffffffffdb18));
      }
      if ((local_13b9 & 1) == 0) {
LAB_003d29c4:
        local_13b9 = 0;
      }
      else {
        bVar2 = cfd::core::DescriptorScriptReference::HasChild();
        in_stack_ffffffffffffdb1c = CONCAT13(bVar2,(int3)in_stack_ffffffffffffdb1c);
        if ((bVar2 & 1) == 0) goto LAB_003d29c4;
        cfd::core::DescriptorScriptReference::GetChild();
        cfd::core::DescriptorScriptReference::operator=(local_1748,local_23e8);
        core::DescriptorScriptReference::~DescriptorScriptReference
                  ((DescriptorScriptReference *)in_stack_ffffffffffffdb10);
        cfd::core::DescriptorScriptReference::operator=(local_13b8,local_1748);
        local_13c0 = local_13c0 + 1;
      }
      DescriptorScriptData::~DescriptorScriptData(in_stack_ffffffffffffdb10);
      core::DescriptorScriptReference::~DescriptorScriptReference
                ((DescriptorScriptReference *)in_stack_ffffffffffffdb10);
    }
    core::DescriptorScriptReference::~DescriptorScriptReference
              ((DescriptorScriptReference *)in_stack_ffffffffffffdb10);
  }
  bVar1 = std::
          vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
          ::empty((vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
                   *)in_stack_ffffffffffffdb20);
  if ((!bVar1) && (local_30 != 0)) {
    local_23f0 = local_588;
    local_23f8._M_current =
         (DescriptorKeyReference *)
         std::
         vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
         ::begin((vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
                  *)in_stack_ffffffffffffdb08);
    local_2400 = (DescriptorKeyReference *)
                 std::
                 vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
                 ::end((vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
                        *)in_stack_ffffffffffffdb08);
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<cfd::core::DescriptorKeyReference_*,_std::vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>_>
                               *)in_stack_ffffffffffffdb10,
                              (__normal_iterator<cfd::core::DescriptorKeyReference_*,_std::vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>_>
                               *)in_stack_ffffffffffffdb08), bVar1) {
      local_2408 = __gnu_cxx::
                   __normal_iterator<cfd::core::DescriptorKeyReference_*,_std::vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>_>
                   ::operator*(&local_23f8);
      in_stack_ffffffffffffdb10 = (DescriptorScriptData *)&stack0xffffffffffffdbd0;
      uVar10 = cfd::core::DescriptorKeyReference::GetKeyType();
      in_stack_ffffffffffffdb10->type = uVar10;
      const::$_0::operator()::DescriptorKeyReference_const___const
                (in_stack_ffffffffffffdc48,in_stack_ffffffffffffdc40);
      std::vector<cfd::DescriptorKeyData,_std::allocator<cfd::DescriptorKeyData>_>::push_back
                ((vector<cfd::DescriptorKeyData,_std::allocator<cfd::DescriptorKeyData>_> *)
                 in_stack_ffffffffffffdb20,(value_type *)CONCAT44(in_stack_ffffffffffffdb1c,uVar10))
      ;
      DescriptorKeyData::~DescriptorKeyData((DescriptorKeyData *)0x3d2b26);
      __gnu_cxx::
      __normal_iterator<cfd::core::DescriptorKeyReference_*,_std::vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>_>
      ::operator++(&local_23f8);
    }
  }
  local_31 = 1;
  core::DescriptorKeyReference::~DescriptorKeyReference
            ((DescriptorKeyReference *)in_stack_ffffffffffffdb10);
  std::vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
  ::~vector((vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
             *)in_stack_ffffffffffffdb20);
  core::DescriptorNode::~DescriptorNode((DescriptorNode *)in_stack_ffffffffffffdb10);
  std::
  vector<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
  ::~vector((vector<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
             *)in_stack_ffffffffffffdb20);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)in_stack_ffffffffffffdb20);
  core::Descriptor::~Descriptor((Descriptor *)0x3d2bb3);
  if ((local_31 & 1) == 0) {
    DescriptorScriptData::~DescriptorScriptData(in_stack_ffffffffffffdb10);
  }
  return in_RDI;
}

Assistant:

DescriptorScriptData AddressFactory::ParseOutputDescriptor(
    const std::string& descriptor, const std::string& bip32_derivation_path,
    std::vector<DescriptorScriptData>* script_list,
    std::vector<DescriptorKeyData>* multisig_key_list,
    std::vector<KeyData>* key_list) const {
  if (script_list != nullptr) script_list->clear();
  if (multisig_key_list != nullptr) multisig_key_list->clear();

  static auto get_keystr_function =
      [](const DescriptorKeyReference& key_ref) -> std::string {
    if (key_ref.HasExtPrivkey()) {
      return key_ref.GetExtPrivkey().ToString();
    } else if (key_ref.HasExtPubkey()) {
      return key_ref.GetExtPubkey().ToString();
    } else {
      return key_ref.GetPubkey().GetHex();
    }
  };

  DescriptorScriptData result;
  result.key_type = DescriptorKeyType::kDescriptorKeyNull;  // dummy init
  result.address_type = AddressType::kP2shAddress;          // dummy init
  result.multisig_req_sig_num = 0;
  Descriptor desc = Descriptor::Parse(descriptor, &prefix_list_);
  std::vector<std::string> args;
  for (uint32_t index = 0; index < desc.GetNeedArgumentNum(); ++index) {
    args.push_back(bip32_derivation_path);
  }
  if (key_list != nullptr) {
    auto temp_list = desc.GetKeyDataAll(&args);
    for (const auto& key : temp_list) {
      key_list->push_back(key);
    }
  }
  std::vector<DescriptorScriptReference> script_refs =
      desc.GetReferenceAll(&args);
  DescriptorNode node = desc.GetNode();

  result.type = node.GetScriptType();
  result.key_type = DescriptorKeyType::kDescriptorKeyNull;
  result.depth = 0;
  result.locking_script = script_refs[0].GetLockingScript();
  if (script_refs[0].HasAddress()) {
    result.address = script_refs[0].GenerateAddress(type_);
    result.address_type = script_refs[0].GetAddressType();
  }
  if (script_refs[0].HasRedeemScript()) {
    result.redeem_script = script_refs[0].GetRedeemScript();
  }

  std::vector<DescriptorKeyReference> multisig_keys;
  uint32_t multisig_req_num = 0;
  bool use_script_list = false;
  DescriptorKeyReference key_ref;
  switch (result.type) {
    case DescriptorScriptType::kDescriptorScriptCombo:
      for (const auto& ref : script_refs) {
        DescriptorScriptData ref_data;
        ref_data.type = ref.GetScriptType();
        ref_data.depth = 0;
        ref_data.locking_script = ref.GetLockingScript();
        if (ref.HasAddress()) {
          ref_data.address = ref.GenerateAddress(type_);
          ref_data.address_type = ref.GetAddressType();
        } else {
          ref_data.address_type = AddressType::kP2shAddress;  // dummy init
        }
        if (ref.HasRedeemScript()) {
          ref_data.redeem_script = ref.GetRedeemScript();
          ref_data.key_type = DescriptorKeyType::kDescriptorKeyNull;
        } else {
          key_ref = ref.GetKeyList()[0];
          ref_data.key_type = key_ref.GetKeyType();
          ref_data.key = get_keystr_function(key_ref);
          if (result.key_type == DescriptorKeyType::kDescriptorKeyNull) {
            result.key_type = ref_data.key_type;
            result.key = ref_data.key;
          }
        }
        if (script_list != nullptr) script_list->push_back(ref_data);
      }
      break;
    case DescriptorScriptType::kDescriptorScriptSh:
    case DescriptorScriptType::kDescriptorScriptWsh:
      use_script_list = true;
      break;
    case DescriptorScriptType::kDescriptorScriptPk:
    case DescriptorScriptType::kDescriptorScriptPkh:
    case DescriptorScriptType::kDescriptorScriptWpkh:
      key_ref = script_refs[0].GetKeyList()[0];
      result.key_type = key_ref.GetKeyType();
      result.key = get_keystr_function(key_ref);
      break;
    case DescriptorScriptType::kDescriptorScriptMulti:
    case DescriptorScriptType::kDescriptorScriptSortedMulti:
      multisig_keys = script_refs[0].GetKeyList();
      result.multisig_req_sig_num = script_refs[0].GetReqNum();
      break;
    case DescriptorScriptType::kDescriptorScriptTaproot:
      key_ref = script_refs[0].GetKeyList()[0];
      result.branch = script_refs[0].GetTapBranch();
      result.tree = script_refs[0].GetScriptTree();
      result.key_type = key_ref.GetKeyType();
      if (key_ref.HasExtPrivkey()) {
        result.key = key_ref.GetExtPrivkey().ToString();
      } else if (key_ref.HasExtPubkey()) {
        result.key = key_ref.GetExtPubkey().ToString();
      } else {
        result.key_type = DescriptorKeyType::kDescriptorKeySchnorr;
        result.key = key_ref.GetSchnorrPubkey().GetHex();
      }
      break;
    case DescriptorScriptType::kDescriptorScriptRaw:
    case DescriptorScriptType::kDescriptorScriptAddr:
    default:
      break;
  }

  if (use_script_list) {
    DescriptorScriptReference script_ref = script_refs[0];
    bool is_loop = script_ref.HasChild();
    uint32_t depth = 0;
    result.redeem_script = (is_loop) ? Script() : script_ref.GetRedeemScript();
    while (is_loop) {
      DescriptorScriptReference child;
      DescriptorScriptData data;
      switch (script_ref.GetScriptType()) {
        case DescriptorScriptType::kDescriptorScriptSh:
        case DescriptorScriptType::kDescriptorScriptWsh:
          if (!script_ref.HasChild()) {
            result.redeem_script = script_ref.GetRedeemScript();
          } else {
            child = script_ref.GetChild();
            if ((child.GetScriptType() ==
                 DescriptorScriptType::kDescriptorScriptMulti) ||
                (child.GetScriptType() ==
                 DescriptorScriptType::kDescriptorScriptSortedMulti)) {
              multisig_keys = child.GetKeyList();
              multisig_req_num = child.GetReqNum();
              result.multisig_req_sig_num = multisig_req_num;
              is_loop = false;
            } else if (
                child.GetScriptType() ==
                DescriptorScriptType::kDescriptorScriptMiniscript) {
              is_loop = false;
            }
            if (child.GetScriptType() !=
                DescriptorScriptType::kDescriptorScriptWpkh) {
              result.redeem_script = script_ref.GetRedeemScript();
            }
          }
          break;
        // case DescriptorScriptType::kDescriptorScriptPk:
        // case DescriptorScriptType::kDescriptorScriptPkh:
        // case DescriptorScriptType::kDescriptorScriptWpkh:
        default:
          is_loop = false;
          break;
      }
      data.type = script_ref.GetScriptType();
      data.depth = depth;
      data.locking_script = script_ref.GetLockingScript();
      data.address = script_ref.GenerateAddress(type_);
      data.address_type = script_ref.GetAddressType();
      if (script_ref.HasRedeemScript()) {
        data.redeem_script = script_ref.GetRedeemScript();
      }
      if (script_ref.HasKey()) {
        key_ref = script_ref.GetKeyList()[0];
        data.key_type = key_ref.GetKeyType();
        data.key = get_keystr_function(key_ref);
        result.key_type = key_ref.GetKeyType();
        result.key = get_keystr_function(key_ref);
      } else {
        data.key_type = DescriptorKeyType::kDescriptorKeyNull;
      }
      data.multisig_req_sig_num = multisig_req_num;

      if (script_list != nullptr) script_list->push_back(data);
      if (is_loop && script_ref.HasChild()) {
        child = script_ref.GetChild();
        script_ref = child;
        ++depth;
      } else {
        is_loop = false;
      }
    }
  }

  if ((!multisig_keys.empty()) && multisig_key_list) {
    for (const auto& ref : multisig_keys) {
      DescriptorKeyData key_data{ref.GetKeyType(), get_keystr_function(ref)};
      multisig_key_list->push_back(key_data);
    }
  }
  return result;
}